

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

bool clip_image_load_from_bytes(uchar *bytes,size_t bytes_length,clip_image_u8 *img)

{
  pointer __dest;
  uchar *__src;
  int ny;
  int nx;
  int nc;
  int local_fc;
  int local_f8;
  int local_f4;
  stbi__context local_f0;
  
  local_f0.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_f0.read_from_callbacks = 0;
  local_f0.callback_already_read = 0;
  local_f0.img_buffer_end = bytes + (int)bytes_length;
  local_f0.img_buffer = bytes;
  local_f0.img_buffer_original = bytes;
  local_f0.img_buffer_original_end = local_f0.img_buffer_end;
  __src = stbi__load_and_postprocess_8bit(&local_f0,&local_f8,&local_fc,&local_f4,3);
  if (__src == (uchar *)0x0) {
    if ((int)g_logger_state.verbosity_thold < 5) {
      clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to decode image bytes\n",
                        "clip_image_load_from_bytes");
    }
  }
  else {
    img->nx = local_f8;
    img->ny = local_fc;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&img->buf,(long)(local_f8 * local_fc * 3));
    __dest = (img->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy(__dest,__src,
           (long)(img->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)__dest);
    free(__src);
  }
  return __src != (uchar *)0x0;
}

Assistant:

bool clip_image_load_from_bytes(const unsigned char * bytes, size_t bytes_length, struct clip_image_u8 * img) {
    int nx, ny, nc;
    auto * data = stbi_load_from_memory(bytes, bytes_length, &nx, &ny, &nc, 3);
    if (!data) {
        LOG_ERR("%s: failed to decode image bytes\n", __func__);
        return false;
    }
    clip_build_img_from_pixels(data, nx, ny, img);
    stbi_image_free(data);
    return true;
}